

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcplisten.c
# Opt level: O0

int tcp_listener_listen(void *arg)

{
  int iVar1;
  size_t sVar2;
  int *piVar3;
  undefined4 local_b4;
  int local_b0;
  int on;
  int fd;
  int rv;
  sockaddr_storage ss;
  socklen_t len;
  tcp_listener *l;
  void *arg_local;
  
  sVar2 = nni_posix_nn2sockaddr(&fd,(nni_sockaddr *)((long)arg + 0x50));
  ss.__ss_align._4_4_ = (socklen_t)sVar2;
  if ((ss.__ss_align._4_4_ == 0) || (((ushort)fd != 2 && ((ushort)fd != 10)))) {
    arg_local._4_4_ = 0xf;
  }
  else {
    nni_mtx_lock((nni_mtx *)((long)arg + 0x130));
    if ((*(byte *)((long)arg + 0x128) & 1) == 0) {
      if ((*(byte *)((long)arg + 0x129) & 1) == 0) {
        local_b0 = socket((uint)(ushort)fd,0x80001,0);
        if (local_b0 < 0) {
          nni_mtx_unlock((nni_mtx *)((long)arg + 0x130));
          piVar3 = __errno_location();
          arg_local._4_4_ = nni_plat_errno(*piVar3);
        }
        else {
          local_b4 = 1;
          setsockopt(local_b0,1,2,&local_b4,4);
          iVar1 = bind(local_b0,(sockaddr *)&fd,ss.__ss_align._4_4_);
          if (iVar1 < 0) {
            piVar3 = __errno_location();
            on = nni_plat_errno(*piVar3);
            close(local_b0);
            nni_mtx_unlock((nni_mtx *)((long)arg + 0x130));
            arg_local._4_4_ = on;
          }
          else {
            iVar1 = listen(local_b0,0x80);
            if (iVar1 == 0) {
              nni_posix_pfd_init((nni_posix_pfd *)((long)arg + 0xd8),local_b0,tcp_listener_cb,arg);
              *(undefined1 *)((long)arg + 0x128) = 1;
              nni_mtx_unlock((nni_mtx *)((long)arg + 0x130));
              arg_local._4_4_ = 0;
            }
            else {
              piVar3 = __errno_location();
              on = nni_plat_errno(*piVar3);
              close(local_b0);
              nni_mtx_unlock((nni_mtx *)((long)arg + 0x130));
              arg_local._4_4_ = on;
            }
          }
        }
      }
      else {
        nni_mtx_unlock((nni_mtx *)((long)arg + 0x130));
        arg_local._4_4_ = 7;
      }
    }
    else {
      nni_mtx_unlock((nni_mtx *)((long)arg + 0x130));
      arg_local._4_4_ = 0xb;
    }
  }
  return arg_local._4_4_;
}

Assistant:

static int
tcp_listener_listen(void *arg)
{
	tcp_listener           *l = arg;
	socklen_t               len;
	struct sockaddr_storage ss;
	int                     rv;
	int                     fd;

	if (((len = nni_posix_nn2sockaddr(&ss, &l->sa)) == 0) ||
#ifdef NNG_ENABLE_IPV6
	    ((ss.ss_family != AF_INET) && (ss.ss_family != AF_INET6))
#else
	    (ss.ss_family != AF_INET)
#endif
	) {
		return (NNG_EADDRINVAL);
	}

	nni_mtx_lock(&l->mtx);
	if (l->started) {
		nni_mtx_unlock(&l->mtx);
		return (NNG_ESTATE);
	}
	if (l->closed) {
		nni_mtx_unlock(&l->mtx);
		return (NNG_ECLOSED);
	}

	if ((fd = socket(ss.ss_family, SOCK_STREAM | SOCK_CLOEXEC, 0)) < 0) {
		nni_mtx_unlock(&l->mtx);
		return (nni_plat_errno(errno));
	}

// On the Windows Subsystem for Linux, SO_REUSEADDR behaves like Windows
// SO_REUSEADDR, which is almost completely different (and wrong!) from
// traditional SO_REUSEADDR.
#if defined(SO_REUSEADDR) && !defined(NNG_PLATFORM_WSL)
	{
		int on = 1;
		// If for some reason this doesn't work, it's probably ok.
		// Second bind will fail.
		(void) setsockopt(
		    fd, SOL_SOCKET, SO_REUSEADDR, &on, sizeof(on));
	}
#endif

	if (bind(fd, (struct sockaddr *) &ss, len) < 0) {
		rv = nni_plat_errno(errno);
		(void) close(fd);
		nni_mtx_unlock(&l->mtx);
		return (rv);
	}

	// Listen -- 128 depth is probably sufficient.  If it isn't, other
	// bad things are going to happen.
	if (listen(fd, 128) != 0) {
		rv = nni_plat_errno(errno);
		(void) close(fd);
		nni_mtx_unlock(&l->mtx);
		return (rv);
	}

	nni_posix_pfd_init(&l->pfd, fd, tcp_listener_cb, l);

	l->started = true;
	nni_mtx_unlock(&l->mtx);

	return (0);
}